

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O3

Result wabt::ParseDouble(LiteralType literal_type,char *s,char *end,uint64_t *out_bits)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  Result RVar6;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  byte bVar10;
  int iVar11;
  byte *pbVar12;
  char *pcVar13;
  byte *pbVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  int iVar20;
  
  switch(literal_type) {
  case Int:
  case Float:
    RVar6 = anon_unknown_0::FloatParser<double>::ParseFloat(s,end,out_bits);
    return (Result)RVar6.enum_;
  case Hexfloat:
    break;
  case Infinity:
    pcVar13 = s + ((*s - 0x2bU & 0xfd) == 0);
    if (pcVar13 < end) {
      pcVar7 = "inf" + ((long)end - (long)pcVar13);
      lVar16 = 0;
      do {
        if (lVar16 == 3) goto LAB_0015c8f9;
        if (pcVar13[lVar16] != "inf"[lVar16]) goto LAB_0015cc01;
        lVar19 = lVar16 + 1;
        lVar16 = lVar16 + 1;
      } while (pcVar13 + lVar19 != end);
    }
    else {
      pcVar7 = "inf";
    }
    if (*pcVar7 != '\0') {
LAB_0015cc01:
      __assert_fail("StringStartsWith(s, end, \"inf\")",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/literal.cc"
                    ,0x1a4,
                    "static void wabt::(anonymous namespace)::FloatParser<double>::ParseInfinity(const char *, const char *, Uint *) [T = double]"
                   );
    }
LAB_0015c8f9:
    *out_bits = ((ulong)(*s != '-') << 0x3f) + 0xfff0000000000000;
    return (Result)Ok;
  case Nan:
    pcVar13 = s + ((*s - 0x2bU & 0xfd) == 0);
    if (pcVar13 < end) {
      pcVar7 = "nan" + ((long)end - (long)pcVar13);
      lVar16 = 0;
      do {
        if (lVar16 == 3) goto LAB_0015c779;
        if (pcVar13[lVar16] != "nan"[lVar16]) goto LAB_0015cbc3;
        lVar19 = lVar16 + 1;
        lVar16 = lVar16 + 1;
      } while (pcVar13 + lVar19 != end);
    }
    else {
      pcVar7 = "nan";
    }
    if (*pcVar7 != '\0') {
LAB_0015cbc3:
      __assert_fail("StringStartsWith(s, end, \"nan\")",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/literal.cc"
                    ,0xd9,
                    "static Result wabt::(anonymous namespace)::FloatParser<double>::ParseNan(const char *, const char *, Uint *) [T = double]"
                   );
    }
LAB_0015c779:
    pcVar7 = pcVar13 + 3;
    if (pcVar7 == end) {
      uVar15 = 0x8000000000000;
LAB_0015c9bf:
      *out_bits = uVar15 + 0xfff0000000000000 + ((ulong)(*s != '-') << 0x3f);
      return (Result)Ok;
    }
    if (pcVar7 < end) {
      pcVar8 = ":0x" + ((long)end - (long)pcVar7);
      lVar16 = 0;
      do {
        if (lVar16 == 3) goto LAB_0015c938;
        if (pcVar7[lVar16] != ":0x"[lVar16]) goto LAB_0015cc20;
        lVar19 = lVar16 + 1;
        lVar16 = lVar16 + 1;
      } while (pcVar7 + lVar19 != end);
    }
    else {
      pcVar8 = ":0x";
    }
    if (*pcVar8 != '\0') {
LAB_0015cc20:
      __assert_fail("StringStartsWith(s, end, \":0x\")",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/literal.cc"
                    ,0xdf,
                    "static Result wabt::(anonymous namespace)::FloatParser<double>::ParseNan(const char *, const char *, Uint *) [T = double]"
                   );
    }
LAB_0015c938:
    pcVar13 = pcVar13 + 6;
    if (end <= pcVar13) {
      return (Result)Error;
    }
    uVar15 = 0;
    do {
      iVar17 = (int)*pcVar13;
      if (iVar17 != 0x5f) {
        uVar18 = iVar17 - 0x30;
        if (9 < uVar18) {
          if (iVar17 - 0x61U < 6) {
            uVar18 = iVar17 - 0x57;
          }
          else {
            if (5 < iVar17 - 0x41U) {
              return (Result)Error;
            }
            uVar18 = iVar17 - 0x37;
          }
        }
        uVar15 = uVar15 * 0x10 + (ulong)uVar18;
        if (0xfffffffffffff < uVar15) {
          return (Result)Error;
        }
      }
      pcVar13 = pcVar13 + 1;
    } while (pcVar13 < end);
    if (uVar15 == 0) {
      return (Result)Error;
    }
    if (uVar15 < 0x10000000000000) goto LAB_0015c9bf;
    goto LAB_0015cc44;
  default:
    abort();
  }
  cVar1 = *s;
  pcVar13 = s + ((cVar1 - 0x2bU & 0xfd) == 0);
  if (pcVar13 < end) {
    pcVar7 = end + (long)(":0x" + (1 - (long)pcVar13));
    lVar16 = 0;
    do {
      if (lVar16 == 2) goto LAB_0015c7db;
      if (pcVar13[lVar16] != ":0x"[lVar16 + 1]) goto LAB_0015cbe2;
      lVar19 = lVar16 + 1;
      lVar16 = lVar16 + 1;
    } while (pcVar13 + lVar19 != end);
  }
  else {
    pcVar7 = "0x";
  }
  if (*pcVar7 != '\0') {
LAB_0015cbe2:
    __assert_fail("StringStartsWith(s, end, \"0x\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/literal.cc"
                  ,0x107,
                  "static Result wabt::(anonymous namespace)::FloatParser<double>::ParseHex(const char *, const char *, Uint *) [T = double]"
                 );
  }
LAB_0015c7db:
  pbVar14 = (byte *)(pcVar13 + 2);
  if (pbVar14 < end) {
    bVar2 = false;
    iVar17 = 0;
    uVar15 = 0;
    bVar4 = false;
    bVar3 = false;
    do {
      bVar10 = *pbVar14;
      iVar20 = iVar17;
      if (bVar10 == 0x2e) {
        bVar2 = true;
      }
      else if (bVar10 != 0x5f) {
        iVar20 = (int)(char)bVar10;
        uVar18 = iVar20 - 0x30;
        if (9 < uVar18) {
          if (iVar20 - 0x61U < 6) {
            uVar18 = iVar20 - 0x57;
          }
          else {
            if (5 < iVar20 - 0x41U) {
              if (uVar15 == 0) goto LAB_0015cba4;
              if ((bVar10 | 0x20) != 0x70) {
                __assert_fail("*s == \'p\' || *s == \'P\'",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/literal.cc"
                              ,0x137,
                              "static Result wabt::(anonymous namespace)::FloatParser<double>::ParseHex(const char *, const char *, Uint *) [T = double]"
                             );
              }
              bVar10 = pbVar14[1];
              iVar20 = 0;
              pbVar12 = pbVar14 + 1;
              iVar11 = 0;
              if (bVar10 == 0x2b) {
                pbVar12 = pbVar14 + 2;
                iVar11 = iVar17;
              }
              if (bVar10 == 0x2d) {
                pbVar12 = pbVar14 + 2;
                iVar11 = -iVar17;
              }
              if (end <= pbVar12) goto LAB_0015cb94;
              iVar20 = 0;
              goto LAB_0015cb64;
            }
            uVar18 = iVar20 - 0x37;
          }
        }
        if (uVar15 < 0x20000000000000) {
          uVar15 = uVar15 * 0x10 + (ulong)uVar18;
          iVar20 = iVar17 + -4;
          if (!bVar2) {
            iVar20 = iVar17;
          }
        }
        else {
          bVar3 = true;
          if (uVar18 == 0) {
            bVar3 = bVar4;
          }
          if (bVar4) {
            bVar3 = bVar4;
          }
          iVar20 = iVar17 + 4;
          bVar4 = bVar3;
          if (bVar2) {
            iVar20 = iVar17;
          }
        }
      }
      iVar17 = iVar20;
      pbVar14 = pbVar14 + 1;
    } while (pbVar14 < end);
    iVar11 = 0;
    if (uVar15 != 0) goto LAB_0015c897;
  }
  goto LAB_0015cba4;
LAB_0015cb64:
  do {
    if ((char)*pbVar12 != 0x5f) {
      uVar18 = (int)(char)*pbVar12 - 0x30;
      if (9 < uVar18) {
        __assert_fail("digit <= 9",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/literal.cc"
                      ,0x14c,
                      "static Result wabt::(anonymous namespace)::FloatParser<double>::ParseHex(const char *, const char *, Uint *) [T = double]"
                     );
      }
      iVar20 = uVar18 + iVar20 * 10;
      if (0x3ff < iVar20 + iVar11) break;
    }
    pbVar12 = pbVar12 + 1;
  } while (pbVar12 != (byte *)end);
LAB_0015cb94:
  iVar11 = -iVar20;
  if (bVar10 != 0x2d) {
    iVar11 = iVar20;
  }
LAB_0015c897:
  uVar9 = 0x3f;
  if (uVar15 != 0) {
    for (; uVar15 >> uVar9 == 0; uVar9 = uVar9 - 1) {
    }
  }
  uVar9 = uVar9 ^ 0x3f;
  iVar17 = iVar17 - (int)uVar9;
  iVar20 = iVar17 + iVar11;
  uVar18 = iVar17 + iVar11 + 0x3f;
  cVar5 = (char)uVar9;
  if (-0x3ff < (int)uVar18) {
    if (uVar15 < 0x20000000000000) {
      if (uVar9 != 0xb) {
        uVar15 = uVar15 << (cVar5 - 0xbU & 0x3f);
      }
    }
    else {
      lVar19 = 1L << (10U - cVar5 & 0x3f);
      lVar16 = 0;
      if (bVar3) {
        lVar16 = lVar19;
      }
      if ((uVar15 >> ((ulong)(byte)(0xbU - cVar5) & 0x3f) & 1) != 0) {
        lVar16 = lVar19;
      }
      uVar15 = lVar16 + uVar15 >> (0xbU - cVar5 & 0x3f);
      if (0x1fffffffffffff < uVar15) {
        uVar18 = iVar20 + 0x40;
      }
    }
    if (0x3ff < (int)uVar18) {
      return (Result)Error;
    }
    uVar15 = (ulong)(uVar18 + 0x3ff) << 0x34 |
             (ulong)(cVar1 == '-') << 0x3f | uVar15 & 0xfffffffffffff;
    goto LAB_0015cbb3;
  }
  if (uVar15 >> 0x34 == 0) {
    if (uVar9 != 0xc) {
      uVar15 = uVar15 << (cVar5 - 0xcU & 0x3f);
    }
  }
  else {
    bVar3 = (bool)(bVar3 | (uVar15 & ~(-1L << (0xbU - cVar5 & 0x3f))) != 0);
    uVar15 = uVar15 >> (0xcU - cVar5 & 0x3f);
  }
  if (0xfffffbcc < uVar18) {
    if (uVar18 != 0xfffffc01) {
      bVar10 = -(char)iVar20 - 0x3f;
      lVar19 = 1L << (bVar10 & 0x3f);
      lVar16 = 0;
      if (bVar3) {
        lVar16 = lVar19;
      }
      if ((uVar15 & (~(-1L << (bVar10 & 0x3f)) | 1L << ((ulong)(-iVar20 - 0x43eU) & 0x3f))) != 0) {
        lVar16 = lVar19;
      }
      uVar15 = lVar16 + uVar15 >> ((byte)(-iVar20 - 0x43eU) & 0x3f) & 0xfffffffffffff;
    }
    if (uVar15 != 0) {
      if (0xfffffffffffff < uVar15) {
LAB_0015cc44:
        __assert_fail("sig <= Traits::kSigMask",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/literal.cc"
                      ,0xb9,
                      "static typename FloatParser<T>::Uint wabt::(anonymous namespace)::FloatParser<double>::Make(bool, int, Uint) [T = double]"
                     );
      }
      uVar15 = uVar15 | (ulong)(cVar1 == '-') << 0x3f;
      goto LAB_0015cbb3;
    }
  }
LAB_0015cba4:
  uVar15 = (ulong)(cVar1 == '-') << 0x3f;
LAB_0015cbb3:
  *out_bits = uVar15;
  return (Result)Ok;
}

Assistant:

Result FloatParser<T>::Parse(LiteralType literal_type,
                             const char* s,
                             const char* end,
                             Uint* out_bits) {
#if COMPILER_IS_MSVC
  if (literal_type == LiteralType::Int && StringStartsWith(s, end, "0x")) {
    // Some MSVC crt implementation of strtof doesn't support hex strings
    literal_type = LiteralType::Hexfloat;
  }
#endif
  switch (literal_type) {
    case LiteralType::Int:
    case LiteralType::Float:
      return ParseFloat(s, end, out_bits);

    case LiteralType::Hexfloat:
      return ParseHex(s, end, out_bits);

    case LiteralType::Infinity:
      ParseInfinity(s, end, out_bits);
      return Result::Ok;

    case LiteralType::Nan:
      return ParseNan(s, end, out_bits);
  }

  WABT_UNREACHABLE;
}